

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O1

bool stackjit::TypeSystem::fromString(string *typeName,PrimitiveTypes *primitiveType)

{
  int iVar1;
  PrimitiveTypes PVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)typeName);
  PVar2 = Integer;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)typeName);
    if (iVar1 == 0) {
      PVar2 = Float;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)typeName);
      if (iVar1 == 0) {
        PVar2 = Bool;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)typeName);
        if (iVar1 == 0) {
          PVar2 = Char;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)typeName);
          PVar2 = Void;
          if (iVar1 != 0) {
            return false;
          }
        }
      }
    }
  }
  *primitiveType = PVar2;
  return true;
}

Assistant:

bool TypeSystem::fromString(std::string typeName, PrimitiveTypes& primitiveType) {
		if (typeName == "Int") {
			primitiveType = PrimitiveTypes::Integer;
			return true;
		} else if (typeName == "Float") {
			primitiveType = PrimitiveTypes::Float;
			return true;
		} else if (typeName == "Bool") {
			primitiveType = PrimitiveTypes::Bool;
			return true;
		} else if (typeName == "Char") {
			primitiveType = PrimitiveTypes::Char;
			return true;
		} else if (typeName == "Void") {
			primitiveType = PrimitiveTypes::Void;
			return true;
		}

		return false;
	}